

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcGasTerminalType::~IfcGasTerminalType(IfcGasTerminalType *this)

{
  IfcTypeProduct *this_00;
  void *pvVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)&(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType
                              .super_IfcDistributionElementType.super_IfcElementType.
                              super_IfcTypeProduct.super_IfcTypeObject + -0x18);
  this_00 = (IfcTypeProduct *)
            ((long)&(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
                    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
                    super_IfcTypeObject.field_0x0 + lVar2);
  pvVar1 = &this->field_0x1d0 + lVar2;
  *(undefined8 *)((long)pvVar1 + -0x1d0) = 0x92f118;
  *(undefined8 *)((long)pvVar1 + 0x10) = 0x92f280;
  *(undefined8 *)((long)pvVar1 + -0x148) = 0x92f140;
  *(undefined8 *)((long)pvVar1 + -0x138) = 0x92f168;
  *(undefined8 *)((long)pvVar1 + -0xe0) = 0x92f190;
  *(undefined8 *)((long)pvVar1 + -0x88) = 0x92f1b8;
  *(undefined8 *)((long)pvVar1 + -0x50) = 0x92f1e0;
  *(undefined8 *)((long)pvVar1 + -0x40) = 0x92f208;
  *(undefined8 *)((long)pvVar1 + -0x30) = 0x92f230;
  *(undefined8 *)((long)pvVar1 + -0x20) = 0x92f258;
  if (*(void **)((long)pvVar1 + -0x10) != pvVar1) {
    operator_delete(*(void **)((long)pvVar1 + -0x10));
  }
  *(undefined8 *)&this_00->super_IfcTypeObject = 0x92f8a8;
  *(undefined8 *)&this_00[1].super_IfcTypeObject.field_0x80 = 0x92f970;
  *(undefined8 *)&(this_00->super_IfcTypeObject).field_0x88 = 0x92f8d0;
  (this_00->super_IfcTypeObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x92f8f8;
  *(undefined8 *)&(this_00->super_IfcTypeObject).field_0xf0 = 0x92f920;
  *(undefined8 *)&this_00->field_0x148 = 0x92f948;
  if (*(undefined1 **)&this_00->field_0x158 != &this_00[1].super_IfcTypeObject.field_0x8) {
    operator_delete(*(undefined1 **)&this_00->field_0x158);
  }
  IfcTypeProduct::~IfcTypeProduct(this_00,&PTR_construction_vtable_24__0092f2b8);
  operator_delete(this_00);
  return;
}

Assistant:

IfcGasTerminalType() : Object("IfcGasTerminalType") {}